

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O1

UpVal * luaF_findupval(lua_State *L,StkId level)

{
  global_State *pgVar1;
  GCObject *pGVar2;
  TValue *pTVar3;
  CallInfo *pCVar4;
  GCObject *pGVar5;
  UpVal *list;
  GCObject *pGVar6;
  byte bVar7;
  
  pgVar1 = L->l_G;
  list = (UpVal *)&L->openupval;
  pGVar5 = (GCObject *)level;
  while (pGVar2 = list->next, pGVar2 != (GCObject *)0x0) {
    pTVar3 = (pGVar2->h).array;
    if (pTVar3 < level) break;
    pGVar6 = pGVar2;
    if ((pTVar3 == level) &&
       (bVar7 = (pGVar2->gch).marked ^ 3, pGVar5 = pGVar2, pGVar6 = (GCObject *)list,
       ((pgVar1->currentwhite ^ 3) & bVar7) == 0)) {
      (pGVar2->gch).marked = bVar7;
    }
    list = (UpVal *)pGVar6;
    if (pTVar3 == level) {
      return (UpVal *)pGVar5;
    }
  }
  pGVar5 = luaC_newobj(L,10,0x28,&list->next,0);
  (pGVar5->th).top = level;
  (pGVar5->h).node = (Node *)&pgVar1->uvhead;
  pCVar4 = (CallInfo *)(pgVar1->uvhead).u.l.next;
  (pGVar5->th).ci = pCVar4;
  pCVar4->next = (CallInfo *)pGVar5;
  (pgVar1->uvhead).u.l.next = (UpVal *)pGVar5;
  return (UpVal *)pGVar5;
}

Assistant:

UpVal *luaF_findupval (lua_State *L, StkId level) {
  global_State *g = G(L);
  GCObject **pp = &L->openupval;
  UpVal *p;
  UpVal *uv;
  while (*pp != NULL && (p = gco2uv(*pp))->v >= level) {
    GCObject *o = obj2gco(p);
    lua_assert(p->v != &p->u.value);
    lua_assert(!isold(o) || isold(obj2gco(L)));
    if (p->v == level) {  /* found a corresponding upvalue? */
      if (isdead(g, o))  /* is it dead? */
        changewhite(o);  /* resurrect it */
      return p;
    }
    pp = &p->next;
  }
  /* not found: create a new one */
  uv = &luaC_newobj(L, LUA_TUPVAL, sizeof(UpVal), pp, 0)->uv;
  uv->v = level;  /* current value lives in the stack */
  uv->u.l.prev = &g->uvhead;  /* double link it in `uvhead' list */
  uv->u.l.next = g->uvhead.u.l.next;
  uv->u.l.next->u.l.prev = uv;
  g->uvhead.u.l.next = uv;
  lua_assert(uv->u.l.next->u.l.prev == uv && uv->u.l.prev->u.l.next == uv);
  return uv;
}